

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::chromeRegisterCommandQueue(CLIntercept *this,cl_command_queue queue)

{
  char *__s;
  mapped_type mVar1;
  pointer pcVar2;
  cl_command_queue p_Var3;
  _Alloc_hider _Var4;
  cl_int cVar5;
  cl_int cVar6;
  cl_int cVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  pthread_mutex_t *__mutex;
  cl_uint queueIndex;
  cl_device_id device;
  cl_command_queue queue_local;
  pthread_mutex_t *local_b0;
  mapped_type local_a4;
  cl_command_queue_properties properties;
  string trackName;
  cl_device_type deviceType;
  string deviceIndexString;
  cl_uint queueFamily;
  undefined4 uStack_4c;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  queue_local = queue;
  std::mutex::lock((mutex *)&__mutex->__data);
  device = (cl_device_id)0x0;
  deviceType = 0;
  properties = 0;
  cVar5 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
  cVar6 = (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1000,8,&deviceType,(size_t *)0x0);
  cVar7 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1093,8,&properties,(size_t *)0x0);
  if ((cVar6 == 0 && cVar5 == 0) && cVar7 == 0) {
    local_b0 = __mutex;
    pmVar8 = std::
             map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
             ::operator[](&this->m_QueueNumberMap,&queue_local);
    mVar1 = *pmVar8;
    trackName._M_dataplus._M_p = (pointer)&trackName.field_2;
    trackName._M_string_length = 0;
    trackName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&trackName);
    cacheDeviceInfo(this,device);
    pmVar9 = std::
             map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
             ::operator[](&this->m_DeviceInfoMap,&device);
    deviceIndexString._M_dataplus._M_p = (pointer)&deviceIndexString.field_2;
    deviceIndexString._M_string_length = 0;
    deviceIndexString.field_2._M_local_buf[0] = '\0';
    local_a4 = mVar1;
    getDeviceIndexString(this,device,&deviceIndexString);
    _Var4._M_p = deviceIndexString._M_dataplus._M_p;
    p_Var3 = queue_local;
    pcVar2 = (pmVar9->Name)._M_dataplus._M_p;
    CEnumNameMap::name_device_type_abi_cxx11_
              ((string *)&queueFamily,&this->m_EnumNameMap,pmVar9->Type);
    __s = this->m_StringBuffer;
    snprintf(__s,0x4000," %p.%s %s (%s)",p_Var3,_Var4._M_p,pcVar2,CONCAT44(uStack_4c,queueFamily));
    std::__cxx11::string::~string((string *)&queueFamily);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queueFamily
                   ,&trackName,__s);
    std::__cxx11::string::operator=((string *)&trackName,(string *)&queueFamily);
    std::__cxx11::string::~string((string *)&queueFamily);
    std::__cxx11::string::~string((string *)&deviceIndexString);
    __mutex = local_b0;
    queueFamily = 0;
    queueIndex = 0;
    cVar5 = (*(this->m_Dispatch).clGetCommandQueueInfo)
                      (queue_local,0x418c,4,&queueFamily,(size_t *)0x0);
    cVar6 = (*(this->m_Dispatch).clGetCommandQueueInfo)
                      (queue_local,0x418d,4,&queueIndex,(size_t *)0x0);
    mVar1 = local_a4;
    if (cVar6 == 0 && cVar5 == 0) {
      snprintf(__s,0x4000," (F:%u I:%u)",(ulong)queueFamily,(ulong)queueIndex);
      std::operator+(&deviceIndexString,&trackName,__s);
      std::__cxx11::string::operator=((string *)&trackName,(string *)&deviceIndexString);
      std::__cxx11::string::~string((string *)&deviceIndexString);
    }
    CChromeTracer::addQueueMetadata(&this->m_ChromeTrace,mVar1,&trackName);
    std::__cxx11::string::~string((string *)&trackName);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::chromeRegisterCommandQueue(
    cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_device_id                device = NULL;
    cl_device_type              deviceType = 0;
    cl_command_queue_properties properties = 0;

    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL);
    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof(deviceType),
        &deviceType,
        NULL );
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(properties),
        &properties,
        NULL );

    if( errorCode == CL_SUCCESS )
    {
        unsigned int    queueNumber = m_QueueNumberMap[ queue ];

        std::string trackName;

        if( properties & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            trackName += "OOQ";
        }
        else
        {
            trackName += "IOQ";
        }

        cacheDeviceInfo( device );

        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        {
            std::string deviceIndexString;
            getDeviceIndexString(
                device,
                deviceIndexString );
            CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " %p.%s %s (%s)",
                queue,
                deviceIndexString.c_str(),
                deviceInfo.Name.c_str(),
                enumName().name_device_type( deviceInfo.Type ).c_str() );
            trackName = trackName + m_StringBuffer;
        }

        {
            cl_int  testError = CL_SUCCESS;

            cl_uint queueFamily = 0;
            cl_uint queueIndex = 0;

            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_FAMILY_INTEL,
                sizeof(queueFamily),
                &queueFamily,
                NULL );
            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_INDEX_INTEL,
                sizeof(queueIndex),
                &queueIndex,
                NULL );
            if( testError == CL_SUCCESS )
            {
                CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " (F:%u I:%u)",
                    queueFamily,
                    queueIndex );
                trackName = trackName + m_StringBuffer;
            }
        }

        m_ChromeTrace.addQueueMetadata( queueNumber, trackName );
    }
}